

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void turn(int x,int y)

{
  Position PVar1;
  int in_EDX;
  
  board[x][y] = '\x02';
  PVar1 = aiTurn(board,y,in_EDX,y);
  board[PVar1.x][(long)PVar1 >> 0x20] = '\x01';
  printf("%d %d\n",(long)PVar1.x,(ulong)PVar1 >> 0x20);
  fflush(_stdout);
  return;
}

Assistant:

void turn(int x, int y) {
    board[x][y] = OTHER;

    // AI
    struct Position pos = aiTurn((const char (*)[BOARD_SIZE]) board, ME, x, y);
    board[pos.x][pos.y] = ME;
    printf("%d %d\n", pos.x, pos.y);
    fflush(stdout);
}